

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall
cmProcess::cmProcess
          (cmProcess *this,unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  rep_conflict local_30;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *local_18;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner_local;
  cmProcess *this_local;
  
  local_18 = runner;
  runner_local = (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)this;
  std::optional<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::optional(&this->Timeout);
  this->TimeoutReason_ = Normal;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->StartTime);
  this->ReadHandleClosed = false;
  this->ProcessHandleClosed = false;
  ::cm::uv_process_ptr::uv_process_ptr(&this->Process);
  ::cm::uv_pipe_ptr::uv_pipe_ptr(&this->PipeReader);
  ::cm::uv_timer_ptr::uv_timer_ptr(&this->Timer);
  std::vector<char,_std::allocator<char>_>::vector(&this->Buf);
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::unique_ptr
            (&this->Runner,runner);
  cmProcessOutput::cmProcessOutput(&this->Conv,UTF8,0x10000);
  this->Signal = 0;
  this->ProcessState = Starting;
  Buffer::Buffer(&this->Output);
  std::__cxx11::string::string((string *)&this->Command);
  std::__cxx11::string::string((string *)&this->WorkingDirectory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Arguments);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->ProcessArgs);
  this->TerminationStyle = Normal;
  local_30 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  (this->TotalTime).__r = local_30;
  this->ExitValue = 0;
  this->Id = 0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_38);
  (this->StartTime).__d.__r = (rep)local_38.__d.__r;
  return;
}

Assistant:

cmProcess::cmProcess(std::unique_ptr<cmCTestRunTest> runner)
  : Runner(std::move(runner))
  , Conv(cmProcessOutput::UTF8, CM_PROCESS_BUF_SIZE)
{
  this->TotalTime = cmDuration::zero();
  this->ExitValue = 0;
  this->Id = 0;
  this->StartTime = std::chrono::steady_clock::time_point();
}